

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O2

int ktx::validateIOStream
              (istream *stream,string *filepath,bool warningsAsErrors,bool GLTFBasisU,
              function<void_(const_ktx::ValidationReport_&)> *callback)

{
  _Manager_type p_Var1;
  int iVar2;
  _Any_data local_398;
  _Manager_type local_388;
  _Invoker_type local_380;
  ValidationContextIOStream ctx;
  
  local_398._M_unused._M_object = (void *)0x0;
  local_398._8_8_ = 0;
  local_388 = (_Manager_type)0x0;
  local_380 = callback->_M_invoker;
  p_Var1 = (callback->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_398._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(callback->super__Function_base)._M_functor;
    local_398._8_8_ = *(undefined8 *)((long)&(callback->super__Function_base)._M_functor + 8);
    (callback->super__Function_base)._M_manager = (_Manager_type)0x0;
    callback->_M_invoker = (_Invoker_type)0x0;
    local_388 = p_Var1;
  }
  ValidationContextIOStream::ValidationContextIOStream
            (&ctx,warningsAsErrors,GLTFBasisU,
             (function<void_(const_ktx::ValidationReport_&)> *)&local_398,stream,filepath);
  std::_Function_base::~_Function_base((_Function_base *)&local_398);
  iVar2 = ValidationContext::validate(&ctx.super_ValidationContext,true);
  ValidationContextIOStream::~ValidationContextIOStream(&ctx);
  return iVar2;
}

Assistant:

int validateIOStream(std::istream& stream, const std::string& filepath, bool warningsAsErrors, bool GLTFBasisU, std::function<void(const ValidationReport&)> callback) {
    try {
        ValidationContextIOStream ctx{warningsAsErrors, GLTFBasisU, std::move(callback), stream, filepath};
        return ctx.validate();
    } catch (const FatalValidationError&) {
        return +rc::INVALID_FILE;
    }
}